

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll.c
# Opt level: O2

int ll_insert_head(ll_head *q_head,ll_elem *n,int wait)

{
  atomic_size_t *paVar1;
  int iVar2;
  ll_elem *plVar3;
  size_t count;
  size_t count_00;
  
  if (((ulong)q_head & 3) != 0) {
    __assert_fail("q == ptr_clear(q)",
                  "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x451,
                  "int ll_insert_head(struct ll_head *, struct ll_elem *, int)");
  }
  if ((ll_elem *)((ulong)n & 0xfffffffffffffffc) == n) {
    if (wait == 0) {
      iVar2 = insert_lock(n);
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      unlink_release((ll_head *)n,(ll_elem *)0x1,wait);
    }
    LOCK();
    paVar1 = &((ll_elem *)((ulong)n & 0xfffffffffffffffc))->refcnt;
    *paVar1 = *paVar1 + 1;
    UNLOCK();
    do {
      plVar3 = succ(q_head,&q_head->q);
      iVar2 = insert_between(q_head,n,&q_head->q,(ll_elem *)((ulong)plVar3 & 0xfffffffffffffffc));
      deref_release((ll_head *)((ulong)plVar3 & 0xfffffffffffffffc),(ll_elem *)0x1,count);
    } while (iVar2 == 0);
    deref_release((ll_head *)n,(ll_elem *)0x1,count_00);
    return 1;
  }
  __assert_fail("n == ptr_clear(n)",
                "/workspace/llm4binary/github/license_c_cmakelists/nahratzah[P]ll/src/ll.c",0x452,
                "int ll_insert_head(struct ll_head *, struct ll_elem *, int)");
}

Assistant:

int
ll_insert_head(struct ll_head *q_head, struct ll_elem *n, int wait)
{
	struct ll_elem	*q, *s;

	q = &q_head->q;
	assert(q == ptr_clear(q));
	assert(n == ptr_clear(n));

	/*
	 * Mark n for insert.  If this fails, n is either on a queue or
	 * being inserted/deleted.
	 *
	 * Required that n is properly initialized.
	 */
	if (wait)
		unlink_release(q_head, n, 1);
	else if (!insert_lock(n))
		return 0;
	deref_acquire(n, 1);

	s = ptr_clear(succ(q_head, q));

	/*
	 * We now have:
	 * - q -- the predecessor of the insert position
	 * - s -- the successor of the insert position
	 * - n -- the node we need to insert between p and s
	 *
	 * Note that both s may be deleted by the time we read this
	 * comment.
	 */
	while (!insert_between(q_head, n, q, s)) {
		/*
		 * Insert failed.
		 * This means s is no longer suitable.
		 */

		/* Re-resolve s. */
		deref_release(q_head, s, 1);
		s = ptr_clear(succ(q_head, q));
	}

	/*
	 * We have succesfully inserted n.  Release our reference on n and s.
	 */
	deref_release(q_head, s, 1);
	deref_release(q_head, n, 1);
	return 1;
}